

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDemiter(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *vSuper;
  Gia_Obj_t *pGVar7;
  Vec_Ptr_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x1088,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  uVar10 = 0;
  pGVar6 = Gia_ManPo(p,0);
  vSuper = Vec_IntAlloc(100);
  Gia_ManDupWithConstrCollectAnd_rec
            (p,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),vSuper,1);
  uVar4 = vSuper->nSize;
  if ((int)uVar4 < 2) {
    __assert_fail("Vec_IntSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x108d,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  pcVar8 = "LOR";
  if ((*(uint *)pGVar6 >> 0x1d & 1) == 0) {
    pcVar8 = "LAND";
  }
  printf("The miter is %s-decomposable into %d parts.\n",pcVar8 + 1,(ulong)uVar4);
  Gia_ManLevelNum(p);
  for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    iVar1 = Vec_IntEntry(vSuper,uVar10);
    iVar2 = Abc_Lit2Var(iVar1);
    uVar3 = Gia_ObjLevelId(p,iVar2);
    iVar1 = Abc_Lit2Var(iVar1);
    pGVar7 = Gia_ManObj(p,iVar1);
    pGVar7->Value = uVar3;
  }
  p_00 = Vec_PtrAlloc(uVar4);
  for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    iVar1 = Vec_IntEntry(vSuper,uVar10);
    iVar2 = Abc_Lit2Var(iVar1);
    pGVar7 = Gia_ManObj(p,iVar2);
    uVar3 = Abc_LitIsCompl(iVar1);
    Vec_PtrPush(p_00,(void *)((ulong)uVar3 ^ (ulong)pGVar7));
  }
  Vec_PtrSort(p_00,Gia_ManSortByValue);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar8;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_01);
  iVar1 = 0;
  while ((iVar1 < p->vCis->nSize && (pGVar7 = Gia_ManCi(p,iVar1), pGVar7 != (Gia_Obj_t *)0x0))) {
    uVar4 = Gia_ManAppendCi(p_01);
    pGVar7->Value = uVar4;
    iVar1 = iVar1 + 1;
  }
  iVar1 = 0;
  while ((iVar1 < p->nObjs && (pGVar7 = Gia_ManObj(p,iVar1), pGVar7 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
      iVar2 = Gia_ObjFanin0Copy(pGVar7);
      iVar5 = Gia_ObjFanin1Copy(pGVar7);
      uVar4 = Gia_ManHashAnd(p_01,iVar2,iVar5);
      pGVar7->Value = uVar4;
    }
    iVar1 = iVar1 + 1;
  }
  iVar2 = 0;
  iVar1 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar1 = iVar2;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    pGVar7 = (Gia_Obj_t *)Vec_PtrEntry(p_00,iVar2);
    iVar5 = Gia_Obj2Lit(p,pGVar7);
    uVar4 = Gia_ObjLitCopy(p,iVar5);
    Gia_ManAppendCo(p_01,*(uint *)pGVar6 >> 0x1d & 1 ^ uVar4);
  }
  iVar1 = 0;
  do {
    iVar2 = p->nRegs;
    if (iVar2 <= iVar1) {
LAB_001e0374:
      Gia_ManSetRegNum(p_01,iVar2);
      pGVar9 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      Vec_IntFree(vSuper);
      Vec_PtrFree(p_00);
      return pGVar9;
    }
    pGVar6 = Gia_ManCo(p,(p->vCos->nSize - iVar2) + iVar1);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      goto LAB_001e0374;
    }
    iVar2 = Gia_ObjFanin0Copy(pGVar6);
    Gia_ManAppendCo(p_01,iVar2);
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupDemiter( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vSuper;
    Vec_Ptr_t * vSuperPtr;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjPo;
    int i, iLit;
    assert( Gia_ManPoNum(p) == 1 );
    // decompose
    pObjPo = Gia_ManPo( p, 0 );
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjFanin0(pObjPo), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // report the result
    printf( "The miter is %s-decomposable into %d parts.\n", Gia_ObjFaninC0(pObjPo) ? "OR":"AND", Vec_IntSize(vSuper) );
    // create levels
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Gia_ManObj(p, Abc_Lit2Var(iLit))->Value = Gia_ObjLevelId(p, Abc_Lit2Var(iLit));
    // create pointer array
    vSuperPtr = Vec_PtrAlloc( Vec_IntSize(vSuper) );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Vec_PtrPush( vSuperPtr, Gia_Lit2Obj(p, iLit) );
    Vec_PtrSort( vSuperPtr, (int (*)(void))Gia_ManSortByValue );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create the outputs
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuperPtr, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, Gia_Obj2Lit(p, pObj)) ^ Gia_ObjFaninC0(pObjPo) );
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    Vec_PtrFree( vSuperPtr );
    return pNew;
}